

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O0

string * __thiscall
m2d::savanna::url::to_string_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  bool bVar1;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  url *local_18;
  url *this_local;
  string *str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (url *)__return_storage_ptr__;
  scheme_abi_cxx11_(&local_60,this);
  std::operator+(&local_40,&local_60,"://");
  host_abi_cxx11_(&local_90,this);
  std::operator+(__return_storage_ptr__,&local_40,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator!=(&this->port_,"");
  if (bVar1) {
    port_str_abi_cxx11_(&local_d0,this);
    std::operator+(&local_b0,":",&local_d0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  path_abi_cxx11_(&local_f0,this);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = std::operator!=(&this->query_,"");
  if (bVar1) {
    query_abi_cxx11_(&local_130,this);
    std::operator+(&local_110,"?",&local_130);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  bVar1 = std::operator!=(&this->fragment_,"");
  if (bVar1) {
    fragment_abi_cxx11_(&local_170,this);
    std::operator+(&local_150,"#",&local_170);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string()
		{
			std::string str = scheme() + "://" + host();
			if (port_ != "") {
				str += ":" + port_str();
			}
			str += path();

			if (query_ != "") {
				str += "?" + query();
			}
			if (fragment_ != "") {
				str += "#" + fragment();
			}
			return str;
		}